

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-linux.c
# Opt level: O1

GPtrArray * enumerate_drive_bins(GError **error)

{
  int iVar1;
  GPtrArray *pGVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  GPtrArray *pGVar7;
  undefined8 uVar8;
  ulong uVar9;
  GError *cmd_error;
  char *cmd_out;
  char *cmd_err;
  int exit_code;
  char *local_58;
  long local_50;
  undefined8 local_48;
  int local_3c;
  GError **local_38;
  
  local_50 = 0;
  local_48 = 0;
  local_58 = (char *)0x0;
  iVar1 = g_spawn_command_line_sync("whoami.exe /user /fo csv",&local_50,&local_48,&local_3c);
  if (iVar1 == 0) {
    if (rifiuti_misc_error_quark::q == 0) {
      enumerate_drive_bins_cold_4();
    }
    uVar8 = *(undefined8 *)(local_58 + 8);
  }
  else {
    if (local_3c == 0) {
      g_log("rifiuti2",0x80,"whoami output: %s",local_50);
      lVar3 = g_strsplit(local_50,"\r\n",0);
      lVar4 = g_strsplit(*(undefined8 *)(lVar3 + 8),",",0);
      uVar8 = *(undefined8 *)(lVar4 + 8);
      lVar5 = g_utf8_strlen(uVar8,0xffffffffffffffff);
      pcVar6 = (char *)g_utf8_substring(uVar8,1,lVar5 + -1);
      g_strfreev(lVar4);
      g_strfreev(lVar3);
      if (*pcVar6 != 'S') {
        if (rifiuti_misc_error_quark::q == 0) {
          enumerate_drive_bins_cold_3();
        }
        g_set_error(error,rifiuti_misc_error_quark::q,0,"Invalid format \'%s\'",pcVar6);
        g_free(pcVar6);
        pcVar6 = (char *)0x0;
      }
      goto LAB_00106d56;
    }
    iVar1 = g_utf8_validate(local_48,10,0);
    if (iVar1 == 0) {
      if (rifiuti_misc_error_quark::q == 0) {
        enumerate_drive_bins_cold_2();
      }
      pcVar6 = (char *)0x0;
      g_set_error_literal(error,rifiuti_misc_error_quark::q,0,
                          "Error running whoami with unknown reason");
      goto LAB_00106d56;
    }
    uVar8 = local_48;
    if (rifiuti_misc_error_quark::q == 0) {
      enumerate_drive_bins_cold_1();
      uVar8 = local_48;
    }
  }
  pcVar6 = (char *)0x0;
  g_set_error(error,rifiuti_misc_error_quark::q,0,"Error running whoami: %s",uVar8);
LAB_00106d56:
  g_free(local_50);
  g_free(local_48);
  g_clear_error(&local_58);
  if (pcVar6 != (char *)0x0) {
    local_50 = 0;
    local_58 = (char *)0x0;
    iVar1 = g_file_get_contents("/proc/self/mounts",&local_58,&local_48);
    if (iVar1 == 0) {
      if (rifiuti_misc_error_quark::q == 0) {
        enumerate_drive_bins_cold_5();
      }
      g_set_error_literal(error,rifiuti_misc_error_quark::q,1,*(undefined8 *)(local_50 + 8));
      g_clear_error(&local_50);
      pGVar2 = (GPtrArray *)0x0;
    }
    else {
      pGVar2 = _search_delimited_text(local_58,"9p"," ",2,1);
      g_free(local_58);
    }
    if (pGVar2 != (GPtrArray *)0x0) {
      if (pGVar2->len != 0) {
        local_38 = error;
        pGVar7 = (GPtrArray *)g_ptr_array_new_with_free_func(g_free);
        if (pGVar2->len != 0) {
          uVar9 = 0;
          do {
            uVar8 = g_build_filename(pGVar2->pdata[uVar9],"$Recycle.bin",pcVar6,0);
            iVar1 = g_file_test(uVar8,0x10);
            if (iVar1 == 0) {
              g_free(uVar8);
            }
            else {
              g_ptr_array_add(pGVar7,uVar8);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < pGVar2->len);
        }
        g_ptr_array_free(pGVar2,1);
        if (pGVar7->len != 0) {
          return pGVar7;
        }
        if (rifiuti_misc_error_quark::q == 0) {
          enumerate_drive_bins_cold_6();
        }
        g_set_error_literal(local_38,rifiuti_misc_error_quark::q,1,"No recycle bin found on system")
        ;
        pGVar2 = pGVar7;
      }
      g_ptr_array_free(pGVar2,1);
    }
  }
  return (GPtrArray *)0x0;
}

Assistant:

GPtrArray *
enumerate_drive_bins   (GError   **error)
{
    GPtrArray *mnt_pts, *result;
    char *sid;

    if (NULL == (sid = _get_user_sid (error)))
        return NULL;

    mnt_pts = _probe_mounts (error);
    if (mnt_pts == NULL)
        return NULL;
    if (mnt_pts->len == 0)
    {
        g_ptr_array_free (mnt_pts, TRUE);
        return NULL;
    }

    result = g_ptr_array_new_with_free_func ((GDestroyNotify) g_free);

    for (gsize i = 0; i < mnt_pts->len; i++)
    {
        char *full_rbin_path = g_build_filename (
            (char *) (mnt_pts->pdata[i]), "$Recycle.bin", sid, NULL);
        if (g_file_test (full_rbin_path, G_FILE_TEST_EXISTS))
            g_ptr_array_add (result, full_rbin_path);
        else
            g_free (full_rbin_path);
    }
    g_ptr_array_free (mnt_pts, TRUE);

    if (result->len == 0) {
        g_set_error_literal (error, R2_MISC_ERROR,
            R2_MISC_ERROR_ENUMERATE_MNT,
            "No recycle bin found on system");
        g_ptr_array_free (result, TRUE);
        result = NULL;
    }
    return result;
}